

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O0

void __thiscall
diligent_spirv_cross::SmallVector<diligent_spirv_cross::SPIRBlock::Case,_8UL>::SmallVector
          (SmallVector<diligent_spirv_cross::SPIRBlock::Case,_8UL> *this)

{
  Case *pCVar1;
  SmallVector<diligent_spirv_cross::SPIRBlock::Case,_8UL> *this_local;
  
  VectorView<diligent_spirv_cross::SPIRBlock::Case>::VectorView
            (&this->super_VectorView<diligent_spirv_cross::SPIRBlock::Case>);
  this->buffer_capacity = 0;
  pCVar1 = AlignedBuffer<diligent_spirv_cross::SPIRBlock::Case,_8UL>::data(&this->stack_storage);
  (this->super_VectorView<diligent_spirv_cross::SPIRBlock::Case>).ptr = pCVar1;
  this->buffer_capacity = 8;
  return;
}

Assistant:

SmallVector() SPIRV_CROSS_NOEXCEPT
	{
		this->ptr = stack_storage.data();
		buffer_capacity = N;
	}